

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall
re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  ushort uVar1;
  undefined4 uVar2;
  Regexp *this_00;
  ParseFlags PVar3;
  int iVar4;
  Regexp **ppRVar5;
  undefined1 *puVar6;
  bool bVar7;
  int local_68;
  char local_64 [4];
  int j_2;
  char buf [4];
  Rune r;
  int j_1;
  char *p;
  Regexp *pRStack_48;
  int j;
  Regexp *re;
  Regexp **sub;
  int i;
  Regexp **suffix_local;
  bool *foldcase_local;
  string *prefix_local;
  Regexp *this_local;
  
  std::__cxx11::string::clear();
  *foldcase = false;
  *suffix = (Regexp *)0x0;
  if (this->op_ == '\x05') {
    sub._4_4_ = 0;
    ppRVar5 = Regexp::sub(this);
    while( true ) {
      bVar7 = false;
      if (sub._4_4_ < (int)(uint)this->nsub_) {
        bVar7 = ppRVar5[sub._4_4_]->op_ == '\x12';
      }
      if (!bVar7) break;
      sub._4_4_ = sub._4_4_ + 1;
    }
    if ((sub._4_4_ == 0) || ((int)(uint)this->nsub_ <= sub._4_4_)) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = ppRVar5[sub._4_4_];
      if (this_00->op_ == '\x03') {
        PVar3 = parse_flags(this_00);
        PVar3 = operator&(PVar3,Latin1);
        if ((PVar3 == NoParseFlags) && (0x7f < (this_00->field_7).field_0.max_)) {
          runetochar(local_64,&(this_00->field_7).rune_);
          std::__cxx11::string::append((char *)prefix,(ulong)local_64);
        }
        else {
          std::__cxx11::string::append((ulong)prefix,'\x01');
        }
      }
      else {
        if (this_00->op_ != '\x04') {
          return false;
        }
        PVar3 = parse_flags(this_00);
        PVar3 = operator&(PVar3,Latin1);
        if (PVar3 == NoParseFlags) {
          std::__cxx11::string::resize((ulong)prefix);
          _r = (char *)std::__cxx11::string::operator[]((ulong)prefix);
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
          for (; (int)buf < (this_00->field_7).field_0.max_; buf = (char  [4])((int)buf + 1)) {
            j_2 = *(int *)((this_00->field_7).field_1.name_ + (long)(int)buf * 4);
            if (j_2 < 0x80) {
              *_r = (char)j_2;
              _r = _r + 1;
            }
            else {
              iVar4 = runetochar(_r,&j_2);
              _r = _r + iVar4;
            }
          }
          std::__cxx11::string::operator[]((ulong)prefix);
          std::__cxx11::string::resize((ulong)prefix);
        }
        else {
          std::__cxx11::string::resize((ulong)prefix);
          for (p._4_4_ = 0; p._4_4_ < (this_00->field_7).field_0.max_; p._4_4_ = p._4_4_ + 1) {
            uVar2 = *(undefined4 *)((this_00->field_7).field_1.name_ + (long)p._4_4_ * 4);
            puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)prefix);
            *puVar6 = (char)uVar2;
          }
        }
      }
      PVar3 = parse_flags(ppRVar5[sub._4_4_]);
      PVar3 = operator&(PVar3,FoldCase);
      *foldcase = PVar3 != NoParseFlags;
      iVar4 = sub._4_4_ + 1;
      local_68 = iVar4;
      if (iVar4 < (int)(uint)this->nsub_) {
        for (; local_68 < (int)(uint)this->nsub_; local_68 = local_68 + 1) {
          Incref(ppRVar5[local_68]);
        }
        uVar1 = this->nsub_;
        PVar3 = parse_flags(this);
        pRStack_48 = Concat(ppRVar5 + iVar4,(uint)uVar1 - iVar4,PVar3);
      }
      else {
        pRStack_48 = (Regexp *)operator_new(0x28);
        PVar3 = parse_flags(this);
        Regexp(pRStack_48,kRegexpEmptyMatch,PVar3);
      }
      *suffix = pRStack_48;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Regexp::RequiredPrefix(string *prefix, bool *foldcase, Regexp** suffix) {
  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;
  if (op_ != kRegexpConcat)
    return false;

  // Some number of anchors, then a literal or concatenation.
  int i = 0;
  Regexp** sub = this->sub();
  while (i < nsub_ && sub[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;

  Regexp* re = sub[i];
  switch (re->op_) {
    default:
      return false;

    case kRegexpLiteralString:
      // Convert to string in proper encoding.
      if (re->parse_flags() & Latin1) {
        prefix->resize(re->nrunes_);
        for (int j = 0; j < re->nrunes_; j++)
          (*prefix)[j] = static_cast<char>(re->runes_[j]);
      } else {
        // Convert to UTF-8 in place.
        // Assume worst-case space and then trim.
        prefix->resize(re->nrunes_ * UTFmax);
        char *p = &(*prefix)[0];
        for (int j = 0; j < re->nrunes_; j++) {
          Rune r = re->runes_[j];
          if (r < Runeself)
            *p++ = static_cast<char>(r);
          else
            p += runetochar(p, &r);
        }
        prefix->resize(p - &(*prefix)[0]);
      }
      break;

    case kRegexpLiteral:
      if ((re->parse_flags() & Latin1) || re->rune_ < Runeself) {
        prefix->append(1, static_cast<char>(re->rune_));
      } else {
        char buf[UTFmax];
        prefix->append(buf, runetochar(buf, &re->rune_));
      }
      break;
  }
  *foldcase = (sub[i]->parse_flags() & FoldCase) != 0;
  i++;

  // The rest.
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub[j]->Incref();
    re = Concat(sub + i, nsub_ - i, parse_flags());
  } else {
    re = new Regexp(kRegexpEmptyMatch, parse_flags());
  }
  *suffix = re;
  return true;
}